

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftpproto.c
# Opt level: O3

void handle_child(session_t *sess)

{
  char *str;
  char *left;
  code *pcVar1;
  int iVar2;
  ssize_t sVar3;
  long lVar4;
  
  ftp_relply(sess,0xdc,"(miniftpd 0.1)");
  str = sess->cmdline;
  left = sess->cmd;
LAB_00103af4:
  do {
    memset(str,0,0x820);
    start_cmdio_alarm();
    sVar3 = readline(sess->ctrl_fd,str,0x400);
    if ((int)sVar3 == 0) {
      exit(0);
    }
    if ((int)sVar3 == -1) {
      perror("readline");
      exit(1);
    }
    str_trim_crlf(str);
    str_split(str,left,sess->cmd_arg,' ');
    str_upper(left);
    lVar4 = 8;
    do {
      iVar2 = strcmp(*(char **)((long)&__do_global_dtors_aux_fini_array_entry + lVar4),left);
      if (iVar2 == 0) {
        pcVar1 = *(code **)((long)&ctrl_cmds_map[0].cmd + lVar4);
        if (pcVar1 == (code *)0x0) {
          ftp_relply(sess,0x1f6,"Unimplement command.");
        }
        else {
          (*pcVar1)();
        }
        goto LAB_00103af4;
      }
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x298);
    ftp_relply(sess,500,"Unknown command.");
  } while( true );
}

Assistant:

void handle_child(session_t *sess) {
  ftp_relply(sess, FTP_GREET, "(miniftpd 0.1)");
  int ret;
  while (1) {
    memset(sess->cmdline, 0, MAX_COMMAND_LINE);
    memset(sess->cmd, 0, MAX_COMMAND);
    memset(sess->cmd_arg, 0, MAX_ARG);

    start_cmdio_alarm();

    ret = readline(sess->ctrl_fd, sess->cmdline, MAX_COMMAND_LINE);

    if (ret == -1)
      ERR_EXIT("readline");
    else if (ret == 0)
      exit(EXIT_SUCCESS);
    // 解析读取到的FTP命令与参数，处理FTP命令，然后发送给父进程
    //printf("%s", sess->cmdline);
    str_trim_crlf(sess->cmdline);
    //printf("%s\n", sess->cmdline);

    // 将命令与参数分割
    str_split(sess->cmdline, sess->cmd, sess->cmd_arg, ' ');
    //printf("%s %s\n",sess->cmd,sess->cmd_arg);
    // 将命令全部转化为大写
    str_upper(sess->cmd);

    int i;
    int map_size = sizeof(ctrl_cmds_map) / sizeof(ctrl_cmds_map[0]);
    for (i = 0; i < map_size; ++i) {
      if (strcmp(ctrl_cmds_map[i].cmd, sess->cmd) == 0) {
        if (ctrl_cmds_map[i].cmd_func != NULL) {
          ctrl_cmds_map[i].cmd_func(sess);
        } else {
          ftp_relply(sess, FTP_COMMANDNOTIMPL, "Unimplement command.");
        }
        break;
      }
    }
    if (i == map_size) {
      ftp_relply(sess, FTP_BADCMD, "Unknown command.");
    }
  }
}